

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# candump.c
# Opt level: O1

int main(int argc,char **argv)

{
  byte *pbVar1;
  uint *puVar2;
  char cVar3;
  byte timestamp;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int extraout_EAX;
  undefined7 uVar17;
  int *piVar11;
  char *pcVar12;
  char *pcVar13;
  void *__optval;
  time_t tVar14;
  ssize_t sVar15;
  cmsghdr *__cmsg;
  ulong uVar16;
  byte bVar18;
  bool bVar19;
  char (*pacVar20) [19];
  __u32 frames;
  uint __maxevents;
  size_t sVar21;
  long lVar22;
  epoll_data_t eVar23;
  ulong uVar24;
  char *pcVar25;
  ulong uVar26;
  bool bVar27;
  int local_358;
  uint local_34c;
  int rcvbuf_size;
  byte *local_320;
  FILE *local_318;
  int local_310;
  int local_30c;
  can_err_mask_t err_mask;
  int join_filter;
  ulong local_300;
  undefined4 local_2f8;
  undefined4 local_2f4;
  undefined8 local_2f0;
  undefined8 local_2e8;
  epoll_data_t local_2e0;
  char *local_2d8;
  undefined8 local_2d0;
  long local_2c8;
  can_raw_vcid_options vcid_opts;
  epoll_event event_setup;
  timeval tv;
  msghdr msg;
  sockaddr_can addr;
  timeval local_238;
  ifreq ifr;
  iovec iov;
  char local_1f0 [16];
  int local_1e0;
  epoll_event events_pending [16];
  char ctrlmsg [120];
  char fname [83];
  
  event_setup.data.u64._4_4_ = 0;
  event_setup.events = 1;
  event_setup.data.fd = 0;
  bVar6 = 0;
  rcvbuf_size = 0;
  addr.can_family = 0x1d;
  addr._2_2_ = 0;
  addr.can_ifindex = 0;
  addr.can_addr.j1939.name = 0;
  addr.can_addr._8_8_ = 0;
  vcid_opts.flags = '\x04';
  vcid_opts.tx_vcid = '\0';
  vcid_opts.rx_vcid = '\0';
  vcid_opts.rx_vcid_mask = '\0';
  signal(0xf,sigterm);
  signal(1,sigterm);
  signal(2,sigterm);
  local_238.tv_sec = 0;
  local_238.tv_usec = 0;
  local_318 = (FILE *)argv;
  progname = __xpg_basename(*argv);
  uVar17 = (undefined7)((ulong)progname >> 8);
  local_2f8 = (undefined4)CONCAT71(uVar17,0x61);
  local_2f4 = (undefined4)CONCAT71(uVar17,1);
  local_2c8 = 0xffffffff;
  local_34c = 0xffffff2a;
  bVar5 = false;
  bVar27 = false;
  local_30c = 0;
  local_2e8 = 0;
  local_2d0 = 0;
  local_320 = (byte *)0x0;
  local_2f0 = 0;
  timestamp = 0;
  bVar19 = false;
LAB_00102a8e:
  do {
    while( true ) {
      bVar4 = bVar19;
      iVar8 = argc;
      iVar7 = getopt(argc,(char **)local_318,"t:HciaSs:lf:Ln:r:Dde8xT:h?");
      bVar19 = bVar4;
      if (0x52 < iVar7) break;
      if (iVar7 < 0x48) {
        if (iVar7 == 0x38) {
          bVar6 = bVar6 | 0x20;
        }
        else {
          if (iVar7 != 0x44) {
            if (iVar7 == -1) {
              if (_optind == argc) goto LAB_00103dfb;
              if (bVar6 != 0 && bVar27) {
                main_cold_13();
LAB_00103e0c:
                main_cold_7();
                running = 0;
                signal_num = iVar8;
                return extraout_EAX;
              }
              bVar19 = bVar27;
              if (local_320 != (byte *)0x0 && bVar5) {
                iVar8 = strcmp("-",(char *)local_320);
                if (iVar8 == 0) {
                  bVar5 = false;
                }
                bVar19 = true;
                if (iVar8 != 0) {
                  bVar19 = bVar27;
                }
              }
              if ((char)local_34c == '*') {
                if (bVar5) {
                  main_cold_2();
                  local_34c = 2;
                }
                else {
                  local_34c = 0;
                }
              }
              __maxevents = argc - _optind;
              if (0x10 < (int)__maxevents) {
                main_cold_12();
                return 1;
              }
              local_310 = epoll_create(1);
              if (local_310 < 0) {
                pcVar25 = "epoll_create";
                goto LAB_00103d39;
              }
              if ((int)__maxevents < 1) {
                local_358 = 0;
                goto LAB_0010336c;
              }
              local_2d8 = (char *)(ulong)__maxevents;
              pcVar25 = (char *)0x0;
              local_358 = 0;
              goto LAB_00102d58;
            }
            goto switchD_00102ab5_caseD_62;
          }
          local_2f4 = 0;
        }
      }
      else {
        bVar19 = true;
        if (iVar7 != 0x48) {
          if (iVar7 != 0x4c) goto switchD_00102ab5_caseD_62;
          bVar27 = true;
          bVar19 = bVar4;
        }
      }
    }
    uVar17 = (undefined7)
             ((ulong)((long)&switchD_00102ab5::switchdataD_00106020 +
                     (long)(int)(&switchD_00102ab5::switchdataD_00106020)[iVar7 - 0x61]) >> 8);
    switch(iVar7) {
    case 0x61:
      bVar6 = bVar6 | 1;
      break;
    case 0x62:
    case 0x67:
    case 0x68:
    case 0x6a:
    case 0x6b:
    case 0x6d:
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x75:
    case 0x76:
    case 0x77:
      goto switchD_00102ab5_caseD_62;
    case 99:
      local_2e8 = CONCAT71((int7)((ulong)local_2e8 >> 8),(char)local_2e8 + '\x01');
      break;
    case 100:
      local_2f0 = CONCAT71(uVar17,1);
      break;
    case 0x65:
      bVar6 = bVar6 | 8;
      break;
    case 0x66:
      local_320 = _optarg;
    case 0x6c:
      bVar5 = true;
      break;
    case 0x69:
      bVar6 = bVar6 | 2;
      break;
    case 0x6e:
      iVar8 = atoi((char *)_optarg);
      local_30c = iVar8;
      goto LAB_00102bb3;
    case 0x72:
      iVar8 = atoi((char *)_optarg);
      rcvbuf_size = iVar8;
LAB_00102bb3:
      if (iVar8 < 1) goto switchD_00102ab5_caseD_62;
      break;
    case 0x73:
      local_34c = atoi((char *)_optarg);
      if (2 < (local_34c & 0xff)) goto switchD_00102ab5_caseD_62;
      break;
    case 0x74:
      bVar18 = *_optarg;
      if ((0x39 < bVar18 - 0x41) ||
         (timestamp = bVar18, (0x200000900000001U >> ((ulong)(bVar18 - 0x41) & 0x3f) & 1) == 0)) {
        main_cold_1();
        timestamp = 0;
      }
      local_2f8 = 0x61;
      if (bVar18 == 0x7a) {
        local_2f8 = 0x7a;
      }
      break;
    case 0x78:
      local_2d0 = CONCAT71(uVar17,1);
      break;
    default:
      if (iVar7 != 0x53) {
        if (iVar7 == 0x54) goto code_r0x00102b10;
        goto switchD_00102ab5_caseD_62;
      }
      bVar6 = bVar6 | 4;
    }
  } while( true );
code_r0x00102b10:
  piVar11 = __errno_location();
  *piVar11 = 0;
  local_2c8 = strtol((char *)_optarg,(char **)0x0,0);
  if (*piVar11 != 0) {
switchD_00102ab5_caseD_62:
    print_usage();
    exit(1);
  }
  goto LAB_00102a8e;
  while( true ) {
    if (!bVar27) {
      return local_358;
    }
    pcVar25 = pcVar25 + 1;
    if (pcVar25 == local_2d8) break;
LAB_00102d58:
    pcVar13 = *(char **)(&local_318->_flags + ((long)(int)pcVar25 + (long)_optind) * 2);
    pcVar12 = strchr(pcVar13,0x2c);
    iVar8 = socket(0x1d,3,1);
    sock_info[(long)pcVar25].s = iVar8;
    if (iVar8 < 0) {
      pcVar13 = "socket";
LAB_00103173:
      perror(pcVar13);
LAB_001031b2:
      local_358 = 1;
      bVar27 = false;
    }
    else {
      eVar23.ptr = sock_info + (long)pcVar25;
      event_setup.data.ptr = eVar23.ptr;
      iVar8 = epoll_ctl(local_310,1,iVar8,(epoll_event *)&event_setup);
      if (iVar8 != 0) {
        pcVar13 = "failed to add socket to epoll";
        goto LAB_00103173;
      }
      sock_info[(long)pcVar25].cmdlinename = pcVar13;
      if (pcVar12 == (char *)0x0) {
        sVar21 = strlen(pcVar13);
        iVar8 = (int)sVar21;
      }
      else {
        iVar8 = (int)pcVar12 - (int)pcVar13;
      }
      if (0xf < iVar8) {
        fprintf(_stderr,"name of CAN device \'%s\' is too long!\n",pcVar13);
        goto LAB_001031b2;
      }
      if (max_devname_len < iVar8) {
        max_devname_len = iVar8;
      }
      ifr.ifr_ifrn._0_8_ = 0;
      ifr.ifr_ifrn._8_8_ = 0;
      strncpy((char *)&ifr,pcVar13,(long)iVar8);
      if (ifr.ifr_ifrn._0_4_ == 0x796e61) {
        addr._0_8_ = addr._0_8_ & 0xffffffff;
      }
      else {
        iVar8 = ioctl(*eVar23.ptr,0x8933,&ifr);
        if (iVar8 < 0) {
          main_cold_3();
LAB_00103dfb:
          print_usage();
          exit(0);
        }
        addr.can_ifindex = ifr.ifr_ifru.ifru_ivalue;
      }
      if (pcVar12 == (char *)0x0) {
LAB_00103044:
        setsockopt(*eVar23.ptr,0x65,5,&canfx_on,4);
        setsockopt(*eVar23.ptr,0x65,7,&canfx_on,4);
        setsockopt(*eVar23.ptr,0x65,8,&vcid_opts,4);
        if (rcvbuf_size == 0) {
LAB_001031ee:
          if ((timestamp != 0 || bVar5) || bVar19) {
            if (bVar4) {
              events_pending[0].events = 0x58;
              iVar8 = setsockopt(*eVar23.ptr,1,0x25,events_pending,4);
              if (iVar8 < 0) {
                pcVar13 = "setsockopt SO_TIMESTAMPING is not supported by your Linux kernel";
LAB_0010332b:
                perror(pcVar13);
                local_358 = 1;
              }
            }
            else {
              events_pending[0].events = 1;
              iVar8 = setsockopt(*eVar23.ptr,1,0x1d,events_pending,4);
              if (iVar8 < 0) {
                pcVar13 = "setsockopt SO_TIMESTAMP";
                goto LAB_0010332b;
              }
            }
            if (iVar8 < 0) goto LAB_001032e5;
          }
          if ((char)local_2f0 != '\0') {
            events_pending[0].events = 1;
            iVar8 = setsockopt(*eVar23.ptr,1,0x28,events_pending,4);
            if (iVar8 < 0) {
              perror("setsockopt SO_RXQ_OVFL not supported by your Linux Kernel");
              local_358 = 1;
              goto LAB_001032e5;
            }
          }
          iVar8 = bind(*eVar23.ptr,(sockaddr *)&addr,0x18);
          bVar27 = true;
          if (iVar8 < 0) {
            pcVar13 = "bind";
            goto LAB_001032d5;
          }
        }
        else {
          ctrlmsg[0] = '\x04';
          ctrlmsg[1] = '\0';
          ctrlmsg[2] = '\0';
          ctrlmsg[3] = '\0';
          iVar8 = setsockopt(*eVar23.ptr,1,0x21,&rcvbuf_size,4);
          bVar27 = true;
          if (iVar8 < 0) {
            iVar8 = setsockopt(*eVar23.ptr,1,8,&rcvbuf_size,4);
            if (iVar8 < 0) {
              pcVar13 = "setsockopt SO_RCVBUF";
            }
            else {
              iVar8 = getsockopt(*eVar23.ptr,1,8,events_pending,(socklen_t *)ctrlmsg);
              if (-1 < iVar8) {
                if ((pcVar25 == (char *)0x0) && ((int)events_pending[0].events < rcvbuf_size * 2)) {
                  main_cold_5();
                }
                goto LAB_001031e6;
              }
              pcVar13 = "getsockopt SO_RCVBUF";
            }
            perror(pcVar13);
            local_358 = 1;
            bVar27 = false;
          }
LAB_001031e6:
          if (bVar27) goto LAB_001031ee;
LAB_001032e5:
          bVar27 = false;
        }
      }
      else {
        sVar21 = 0;
        pcVar13 = pcVar12;
        do {
          pcVar13 = strchr(pcVar13 + 1,0x2c);
          sVar21 = sVar21 + 8;
        } while (pcVar13 != (char *)0x0);
        __optval = malloc(sVar21);
        if (__optval == (void *)0x0) {
          main_cold_4();
          goto LAB_001031b2;
        }
        iVar8 = 0;
        err_mask = 0;
        join_filter = 0;
        local_2e0.ptr = eVar23.ptr;
        do {
          pbVar1 = (byte *)(pcVar12 + 1);
          pcVar13 = strchr((char *)pbVar1,0x2c);
          local_300 = CONCAT44(local_300._4_4_,iVar8);
          puVar2 = (uint *)((long)__optval + (long)iVar8 * 8);
          lVar22 = (long)__optval + (long)iVar8 * 8 + 4;
          iVar8 = __isoc99_sscanf(pbVar1,"%x:%x",puVar2,lVar22);
          if (iVar8 == 2) {
            *(byte *)(lVar22 + 3) = *(byte *)(lVar22 + 3) & 0xdf;
            if (pcVar12[9] == ':') {
              *(byte *)((long)puVar2 + 3) = *(byte *)((long)puVar2 + 3) | 0x80;
            }
            iVar8 = (int)local_300 + 1;
          }
          else {
            iVar8 = __isoc99_sscanf(pbVar1,"%x~%x",puVar2,lVar22);
            if (iVar8 == 2) {
              uVar10 = *puVar2;
              *puVar2 = uVar10 | 0x20000000;
              *(byte *)((long)puVar2 + 7) = *(byte *)((long)puVar2 + 7) & 0xdf;
              if (pcVar12[9] == '~') {
                *puVar2 = uVar10 | 0xa0000000;
              }
              iVar8 = (int)local_300 + 1;
            }
            else if ((*pbVar1 | 0x20) == 0x6a) {
              join_filter = 1;
              iVar8 = (int)local_300;
            }
            else {
              iVar7 = __isoc99_sscanf(pbVar1,"#%x",&err_mask);
              iVar8 = (int)local_300;
              if (iVar7 != 1) {
                fprintf(_stderr,"Error in filter option parsing: \'%s\'\n",pbVar1);
                goto LAB_001031b2;
              }
            }
          }
          eVar23 = local_2e0;
          pcVar12 = pcVar13;
        } while (pcVar13 != (char *)0x0);
        if (err_mask != 0) {
          setsockopt(*local_2e0.ptr,0x65,2,&err_mask,4);
        }
        if (join_filter == 0) {
LAB_0010301b:
          if (iVar8 != 0) {
            setsockopt(*eVar23.ptr,0x65,1,__optval,iVar8 << 3);
          }
          free(__optval);
          goto LAB_00103044;
        }
        iVar7 = setsockopt(*eVar23.ptr,0x65,6,&join_filter,4);
        if (-1 < iVar7) goto LAB_0010301b;
        pcVar13 = "setsockopt CAN_RAW_JOIN_FILTERS not supported by your Linux Kernel";
LAB_001032d5:
        perror(pcVar13);
        local_358 = 1;
        bVar27 = false;
      }
    }
  }
LAB_0010336c:
  cVar3 = (char)local_34c;
  if (bVar5) {
    if (local_320 == (byte *)0x0) {
      tVar14 = time((time_t *)ctrlmsg);
      if (tVar14 == -1) {
        perror("time");
        return 1;
      }
      localtime_r((time_t *)ctrlmsg,(tm *)events_pending);
      local_320 = (byte *)fname;
      snprintf((char *)local_320,0x53,"candump-%04d-%02d-%02d_%02d%02d%02d.log",
               (ulong)(events_pending[1].data.u64._4_4_ + 0x76c),
               (ulong)(events_pending[1].data.fd + 1),(ulong)events_pending[1].events,
               (ulong)(uint)events_pending[0].data._4_4_,(ulong)(uint)events_pending[0].data._0_4_,
               (ulong)events_pending[0].events);
    }
    if (cVar3 != '\x02') {
      main_cold_6();
    }
    pbVar1 = local_320;
    fprintf(_stderr,"Enabling Logfile \'%s\'\n",local_320);
    local_318 = fopen((char *)pbVar1,"w");
    if (local_318 == (FILE *)0x0) {
      pcVar25 = "logfile";
      local_318 = (FILE *)0x0;
LAB_00103d39:
      perror(pcVar25);
      return 1;
    }
  }
  else {
    local_318 = (FILE *)0x0;
  }
  msg.msg_iov = &iov;
  iov.iov_base = &main::cu;
  msg.msg_name = &addr;
  msg.msg_iovlen = 1;
  msg.msg_control = ctrlmsg;
  if (running != 0) {
    bVar19 = cVar3 == '\0' && bVar19;
    local_320 = (byte *)0x106140;
    local_2d8 = "";
    if ((byte)local_2e8 == 1) {
      local_2d8 = "\x1b[0m";
    }
    if ((byte)local_2e8 < 2) {
      local_320 = (byte *)0x10658c;
    }
    local_2e0.fd = (int)local_2e8 + -1;
    local_2f0 = CONCAT71(local_2f0._1_7_,bVar19);
    uVar10 = 0;
    do {
      uVar9 = epoll_wait(local_310,(epoll_event *)events_pending,__maxevents,(int)local_2c8);
      if (uVar9 == 0xffffffff) {
        piVar11 = __errno_location();
        if (*piVar11 != 4) goto LAB_00103cb3;
      }
      else if ((uVar9 == 0) && (-1 < (int)local_2c8)) {
LAB_00103cb3:
        running = 0;
      }
      else if (0 < (int)uVar9) {
        local_300 = (ulong)uVar9;
        uVar16 = 0;
        do {
          puVar2 = (uint *)events_pending[uVar16].data.ptr;
          iov.iov_len = 0x810;
          msg.msg_namelen = 0x18;
          msg.msg_controllen = 0x78;
          msg.msg_flags = 0;
          uVar24 = (ulong)*puVar2;
          sVar15 = recvmsg(*puVar2,(msghdr *)&msg,0);
          iVar7 = addr.can_ifindex;
          uVar9 = *puVar2;
          piVar11 = dindex;
          uVar26 = 0;
          do {
            if (*piVar11 == addr.can_ifindex) goto LAB_00103683;
            uVar26 = uVar26 + 1;
            piVar11 = piVar11 + 1;
          } while (uVar26 != 0x1e);
          lVar22 = 0;
          do {
            if (*(int *)((long)dindex + lVar22) != 0) {
              uVar24 = (ulong)uVar9;
              local_1e0 = *(int *)((long)dindex + lVar22);
              iVar8 = ioctl(uVar9,0x8910,local_1f0);
              if (iVar8 < 0) {
                *(undefined4 *)((long)dindex + lVar22) = 0;
              }
            }
            iVar8 = (int)uVar24;
            lVar22 = lVar22 + 4;
          } while (lVar22 != 0x78);
          piVar11 = dindex;
          uVar26 = 0;
          do {
            if (*piVar11 == 0) goto LAB_00103607;
            uVar26 = uVar26 + 1;
            piVar11 = piVar11 + 1;
          } while (uVar26 != 0x1e);
          uVar26 = 0x1e;
LAB_00103607:
          if ((int)uVar26 == 0x1e) goto LAB_00103e0c;
          dindex[uVar26 & 0xffffffff] = iVar7;
          local_1e0 = iVar7;
          iVar8 = ioctl(uVar9,0x8910,local_1f0);
          if (iVar8 < 0) {
            perror("SIOCGIFNAME");
          }
          iVar8 = max_devname_len;
          sVar21 = strlen(local_1f0);
          if (iVar8 < (int)sVar21) {
            max_devname_len = (int)sVar21;
          }
          strcpy(devname[uVar26 & 0xffffffff],local_1f0);
LAB_00103683:
          uVar9 = (uint)sVar15;
          if ((int)uVar9 < 0) {
            bVar27 = (char)local_2f4 == '\0';
            piVar11 = __errno_location();
            iVar8 = *piVar11;
            if (iVar8 == 100 && bVar27) {
              main_cold_11();
            }
            else {
              perror("read");
              local_358 = 1;
            }
            bVar27 = iVar8 != 100 || !bVar27;
          }
          else if ((int)uVar9 < 0xd) {
            main_cold_10();
LAB_00103c81:
            bVar27 = true;
            local_358 = 1;
          }
          else {
            if ((char)main::cu.fd.len < '\0') {
              if (main::cu.xl.len + 0xc != uVar9) {
                main_cold_8();
                goto LAB_00103c81;
              }
            }
            else if ((uVar9 & 0x7fffffff) == 0x10) {
              main::cu.cc.__pad = '\0';
            }
            else {
              if ((uVar9 & 0x7fffffff) != 0x48) {
                main_cold_9();
                goto LAB_00103c81;
              }
              main::cu.cc.__pad = main::cu.cc.__pad | 4;
            }
            if (local_30c == 0) {
              local_30c = 0;
            }
            else {
              local_30c = local_30c + -1;
              if (local_30c == 0) {
                running = 0;
                local_30c = 0;
              }
            }
            __cmsg = (cmsghdr *)msg.msg_control;
            if (msg.msg_control != (void *)0x0 && 0xf < msg.msg_controllen) {
              do {
                if (__cmsg->cmsg_level != 1) break;
                iVar8 = __cmsg->cmsg_type;
                if (iVar8 == 0x28) {
                  puVar2[4] = (uint)__cmsg[1].cmsg_len;
                }
                else if (iVar8 == 0x25) {
                  tv.tv_sec = __cmsg[3].cmsg_len;
                  tv.tv_usec = *(long *)&__cmsg[3].cmsg_level / 1000;
                }
                else if (iVar8 == 0x1d) {
                  tv.tv_sec = __cmsg[1].cmsg_len;
                  tv.tv_usec._0_4_ = __cmsg[1].cmsg_level;
                  tv.tv_usec._4_4_ = __cmsg[1].cmsg_type;
                }
                __cmsg = __cmsg_nxthdr((msghdr *)&msg,__cmsg);
              } while (__cmsg != (cmsghdr *)0x0);
            }
            iVar8 = (int)uVar26;
            uVar9 = puVar2[4] - puVar2[5];
            if (uVar9 != 0) {
              if (cVar3 != '\x02') {
                pcVar25 = "";
                if (1 < uVar9) {
                  pcVar25 = "s";
                }
                printf("DROPCOUNT: dropped %u CAN frame%s on \'%s\' socket (total drops %u)\n",
                       (ulong)uVar9,pcVar25,devname + iVar8);
              }
              if (bVar5) {
                pcVar25 = "";
                if (1 < uVar9) {
                  pcVar25 = "s";
                }
                fprintf(local_318,
                        "DROPCOUNT: dropped %u CAN frame%s on \'%s\' socket (total drops %u)\n",
                        (ulong)uVar9,pcVar25,devname + iVar8,(ulong)puVar2[4]);
              }
              puVar2[5] = puVar2[4];
            }
            bVar18 = bVar6 | 0x10;
            if (-1 < (int)main::cu.cc.can_id) {
              bVar18 = bVar6;
            }
            pcVar25 = " T";
            if ((msg.msg_flags & 4U) == 0) {
              pcVar25 = " R";
            }
            if ((char)local_2d0 == '\0') {
              pcVar25 = "";
            }
            if (bVar5 || bVar19) {
              main::alen = sprint_timestamp(main::afrbuf,(char)local_2f8,&tv,&local_238);
              iVar7 = sprintf(main::afrbuf + (uint)main::alen,"%*s ",(ulong)(uint)max_devname_len,
                              devname + iVar8);
              lVar22 = (long)iVar7 + (long)main::alen;
              main::alen = (int)lVar22;
              iVar7 = snprintf_canframe(main::afrbuf + lVar22,0x189c - lVar22,&main::cu,0);
              main::alen = main::alen + iVar7;
            }
            if (bVar5) {
              fprintf(local_318,"%s%s\n",main::afrbuf,pcVar25);
            }
            if ((char)local_2f0 == '\0') {
              if (cVar3 == '\0') {
                pacVar20 = (char (*) [19])0x10658c;
                if (2 < (byte)local_2e8) {
                  pacVar20 = col_on + iVar8 % 6;
                }
                main::alen = sprintf(main::afrbuf," %s",pacVar20);
                iVar7 = sprint_timestamp(main::afrbuf + main::alen,timestamp,&tv,&local_238);
                lVar22 = (long)main::alen;
                main::alen = (int)(iVar7 + lVar22);
                pacVar20 = (char (*) [19])0x10658c;
                if ((byte)local_2e0._0_1_ < 2) {
                  pacVar20 = col_on + iVar8 % 6;
                }
                iVar8 = sprintf(main::afrbuf + iVar7 + lVar22," %s%*s",pacVar20,
                                (ulong)(uint)max_devname_len,devname + iVar8);
                lVar22 = (long)main::alen;
                main::alen = (int)(iVar8 + lVar22);
                if ((char)local_2d0 != '\0') {
                  pcVar25 = "  TX %s";
                  if ((msg.msg_flags & 4U) == 0) {
                    pcVar25 = "  RX %s";
                  }
                  iVar8 = sprintf(main::afrbuf + iVar8 + lVar22,pcVar25,
                                  extra_m_info + (main::cu.cc.__pad & 3));
                  main::alen = main::alen + iVar8;
                }
                iVar8 = sprintf(main::afrbuf + main::alen,"%s  ",local_2d8);
                lVar22 = (long)iVar8 + (long)main::alen;
                main::alen = (int)lVar22;
                iVar8 = snprintf_long_canframe
                                  (main::afrbuf + lVar22,0x189c - lVar22,&main::cu,(uint)bVar18);
                lVar22 = (long)iVar8 + (long)main::alen;
                iVar8 = (int)lVar22;
                main::alen = iVar8;
                if (((bVar18 & 8) != 0) && ((main::cu.cc.can_id & 0x20000000) != 0)) {
                  main::afrbuf[lVar22 + 2] = '\0';
                  (main::afrbuf + lVar22)[0] = '\n';
                  (main::afrbuf + lVar22)[1] = '\t';
                  main::alen = iVar8 + 2;
                  iVar8 = snprintf_can_error_frame
                                    (main::afrbuf + (long)iVar8 + 2,0x189a - (long)iVar8,
                                     &main::cu.fd,"\n\t");
                  main::alen = main::alen + iVar8;
                }
                printf("%s%s\n",main::afrbuf,local_320);
              }
              else if ((local_34c & 0xff) == 1) {
                printf("%c\b",(ulong)(uint)(int)"|/-\\"[uVar10 & 3]);
                uVar10 = (uVar10 & 3) + 1;
              }
            }
            else {
              printf("%s%s\n",main::afrbuf,pcVar25);
            }
            fflush(_stdout);
            bVar27 = false;
            bVar6 = bVar18;
          }
          if (bVar27) {
            return local_358;
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != local_300);
      }
    } while (running != 0);
  }
  if (0 < (int)__maxevents) {
    lVar22 = 0;
    do {
      close(*(int *)((long)&sock_info[0].s + lVar22));
      lVar22 = lVar22 + 0x18;
    } while ((ulong)__maxevents * 0x18 != lVar22);
  }
  close(local_310);
  if (bVar5) {
    fclose(local_318);
  }
  if (signal_num == 0) {
    iVar8 = 0;
  }
  else {
    iVar8 = signal_num + 0x80;
  }
  return iVar8;
}

Assistant:

int main(int argc, char **argv)
{
	int fd_epoll;
	struct epoll_event events_pending[MAXSOCK];
	struct epoll_event event_setup = {
		.events = EPOLLIN, /* prepare the common part */
	};
	unsigned char timestamp = 0;
	unsigned char logtimestamp = 'a';
	unsigned char hwtimestamp = 0;
	unsigned char down_causes_exit = 1;
	unsigned char dropmonitor = 0;
	unsigned char extra_msg_info = 0;
	unsigned char silent = SILENT_INI;
	unsigned char silentani = 0;
	unsigned char color = 0;
	unsigned char view = 0;
	unsigned char log = 0;
	unsigned char logfrmt = 0;
	int count = 0;
	int rcvbuf_size = 0;
	int opt, num_events;
	int currmax, numfilter;
	int join_filter;
	char *ptr, *nptr;
	struct sockaddr_can addr = {
		.can_family = AF_CAN,
	};
	struct can_raw_vcid_options vcid_opts = {
		.flags = CAN_RAW_XL_VCID_RX_FILTER,
		.rx_vcid = 0,
		.rx_vcid_mask = 0,
	};
	char ctrlmsg[CMSG_SPACE(sizeof(struct timeval)) +
		     CMSG_SPACE(3 * sizeof(struct timespec)) +
		     CMSG_SPACE(sizeof(__u32))];
	struct iovec iov;
	struct msghdr msg;
	struct cmsghdr *cmsg;
	struct can_filter *rfilter;
	can_err_mask_t err_mask;
	static cu_t cu; /* union for CAN CC/FD/XL frames */
	int nbytes, i;
	struct ifreq ifr;
	struct timeval tv, last_tv;
	int timeout_ms = -1; /* default to no timeout */
	FILE *logfile = NULL;
	char fname[83]; /* suggested by -Wformat-overflow= */
	const char *logname = NULL;
	static char afrbuf[AFRSZ]; /* ASCII CAN frame buffer size */
	static int alen;

	signal(SIGTERM, sigterm);
	signal(SIGHUP, sigterm);
	signal(SIGINT, sigterm);

	last_tv.tv_sec = 0;
	last_tv.tv_usec = 0;

	progname = basename(argv[0]);

	while ((opt = getopt(argc, argv, "t:HciaSs:lf:Ln:r:Dde8xT:h?")) != -1) {
		switch (opt) {
		case 't':
			timestamp = optarg[0];
			logtimestamp = optarg[0];
			if ((timestamp != 'a') && (timestamp != 'A') &&
			    (timestamp != 'd') && (timestamp != 'z')) {
				fprintf(stderr, "%s: unknown timestamp mode '%c' - ignored\n",
					progname, optarg[0]);
				timestamp = 0;
			}
			if ((logtimestamp != 'a') && (logtimestamp != 'z')) {
				logtimestamp = 'a';
			}
			break;

		case 'H':
			hwtimestamp = 1;
			break;

		case 'c':
			color++;
			break;

		case 'i':
			view |= CANLIB_VIEW_BINARY;
			break;

		case 'a':
			view |= CANLIB_VIEW_ASCII;
			break;

		case 'S':
			view |= CANLIB_VIEW_SWAP;
			break;

		case 'e':
			view |= CANLIB_VIEW_ERROR;
			break;

		case '8':
			view |= CANLIB_VIEW_LEN8_DLC;
			break;

		case 's':
			silent = atoi(optarg);
			if (silent > SILENT_ON) {
				print_usage();
				exit(1);
			}
			break;

		case 'l':
			log = 1;
			break;

		case 'D':
			down_causes_exit = 0;
			break;

		case 'd':
			dropmonitor = 1;
			break;

		case 'x':
			extra_msg_info = 1;
			break;

		case 'L':
			logfrmt = 1;
			break;

		case 'f':
			logname = optarg;
			log = 1;
			break;

		case 'n':
			count = atoi(optarg);
			if (count < 1) {
				print_usage();
				exit(1);
			}
			break;

		case 'r':
			rcvbuf_size = atoi(optarg);
			if (rcvbuf_size < 1) {
				print_usage();
				exit(1);
			}
			break;

		case 'T':
			errno = 0;
			timeout_ms = strtol(optarg, NULL, 0);
			if (errno != 0) {
				print_usage();
				exit(1);
			}
			break;
		default:
			print_usage();
			exit(1);
			break;
		}
	}

	if (optind == argc) {
		print_usage();
		exit(0);
	}

	if (logfrmt && view) {
		fprintf(stderr, "Log file format selected: Please disable ASCII/BINARY/SWAP/RAWDLC options!\n");
		exit(0);
	}

	/* "-f -"  is equal to "-L" (print logfile format on stdout) */
	if (log && logname && strcmp("-", logname) == 0) {
		log = 0; /* no logging into a file */
		logfrmt = 1; /* print logformat output to stdout */
	}

	if (silent == SILENT_INI) {
		if (log) {
			fprintf(stderr, "Disabled standard output while logging.\n");
			silent = SILENT_ON; /* disable output on stdout */
		} else
			silent = SILENT_OFF; /* default output */
	}

	currmax = argc - optind; /* find real number of CAN devices */

	if (currmax > MAXSOCK) {
		fprintf(stderr, "More than %d CAN devices given on commandline!\n", MAXSOCK);
		return 1;
	}

	fd_epoll = epoll_create(1);
	if (fd_epoll < 0) {
		perror("epoll_create");
		return 1;
	}

	for (i = 0; i < currmax; i++) {
		struct if_info *obj = &sock_info[i];
		ptr = argv[optind + i];
		nptr = strchr(ptr, ',');

		pr_debug("open %d '%s'.\n", i, ptr);

		obj->s = socket(PF_CAN, SOCK_RAW, CAN_RAW);
		if (obj->s < 0) {
			perror("socket");
			return 1;
		}

		event_setup.data.ptr = obj; /* remember the instance as private data */
		if (epoll_ctl(fd_epoll, EPOLL_CTL_ADD, obj->s, &event_setup)) {
			perror("failed to add socket to epoll");
			return 1;
		}

		obj->cmdlinename = ptr; /* save pointer to cmdline name of this socket */

		if (nptr)
			nbytes = nptr - ptr; /* interface name is up the first ',' */
		else
			nbytes = strlen(ptr); /* no ',' found => no filter definitions */

		if (nbytes >= IFNAMSIZ) {
			fprintf(stderr, "name of CAN device '%s' is too long!\n", ptr);
			return 1;
		}

		if (nbytes > max_devname_len)
			max_devname_len = nbytes; /* for nice printing */

		memset(&ifr.ifr_name, 0, sizeof(ifr.ifr_name));
		strncpy(ifr.ifr_name, ptr, nbytes);

		pr_debug("using interface name '%s'.\n", ifr.ifr_name);

		if (strcmp(ANYDEV, ifr.ifr_name) != 0) {
			if (ioctl(obj->s, SIOCGIFINDEX, &ifr) < 0) {
				perror("SIOCGIFINDEX");
				exit(1);
			}
			addr.can_ifindex = ifr.ifr_ifindex;
		} else
			addr.can_ifindex = 0; /* any can interface */

		if (nptr) {
			/* found a ',' after the interface name => check for filters */

			/* determine number of filters to alloc the filter space */
			numfilter = 0;
			ptr = nptr;
			while (ptr) {
				numfilter++;
				ptr++; /* hop behind the ',' */
				ptr = strchr(ptr, ','); /* exit condition */
			}

			rfilter = malloc(sizeof(struct can_filter) * numfilter);
			if (!rfilter) {
				fprintf(stderr, "Failed to create filter space!\n");
				return 1;
			}

			numfilter = 0;
			err_mask = 0;
			join_filter = 0;

			while (nptr) {

				ptr = nptr + 1; /* hop behind the ',' */
				nptr = strchr(ptr, ','); /* update exit condition */

				if (sscanf(ptr, "%x:%x",
					   &rfilter[numfilter].can_id,
					   &rfilter[numfilter].can_mask) == 2) {
					rfilter[numfilter].can_mask &= ~CAN_ERR_FLAG;
					if (*(ptr + 8) == ':')
						rfilter[numfilter].can_id |= CAN_EFF_FLAG;
					numfilter++;
				} else if (sscanf(ptr, "%x~%x",
						  &rfilter[numfilter].can_id,
						  &rfilter[numfilter].can_mask) == 2) {
					rfilter[numfilter].can_id |= CAN_INV_FILTER;
					rfilter[numfilter].can_mask &= ~CAN_ERR_FLAG;
					if (*(ptr + 8) == '~')
						rfilter[numfilter].can_id |= CAN_EFF_FLAG;
					numfilter++;
				} else if (*ptr == 'j' || *ptr == 'J') {
					join_filter = 1;
				} else if (sscanf(ptr, "#%x", &err_mask) != 1) {
					fprintf(stderr, "Error in filter option parsing: '%s'\n", ptr);
					return 1;
				}
			}

			if (err_mask)
				setsockopt(obj->s, SOL_CAN_RAW, CAN_RAW_ERR_FILTER,
					   &err_mask, sizeof(err_mask));

			if (join_filter && setsockopt(obj->s, SOL_CAN_RAW, CAN_RAW_JOIN_FILTERS,
						      &join_filter, sizeof(join_filter)) < 0) {
				perror("setsockopt CAN_RAW_JOIN_FILTERS not supported by your Linux Kernel");
				return 1;
			}

			if (numfilter)
				setsockopt(obj->s, SOL_CAN_RAW, CAN_RAW_FILTER,
					   rfilter, numfilter * sizeof(struct can_filter));

			free(rfilter);

		} /* if (nptr) */

		/* try to switch the socket into CAN FD mode */
		setsockopt(obj->s, SOL_CAN_RAW, CAN_RAW_FD_FRAMES, &canfx_on, sizeof(canfx_on));

		/* try to switch the socket into CAN XL mode */
		setsockopt(obj->s, SOL_CAN_RAW, CAN_RAW_XL_FRAMES, &canfx_on, sizeof(canfx_on));

		/* try to enable the CAN XL VCID pass through mode */
		setsockopt(obj->s, SOL_CAN_RAW, CAN_RAW_XL_VCID_OPTS, &vcid_opts, sizeof(vcid_opts));

		if (rcvbuf_size) {
			int curr_rcvbuf_size;
			socklen_t curr_rcvbuf_size_len = sizeof(curr_rcvbuf_size);

			/* try SO_RCVBUFFORCE first, if we run with CAP_NET_ADMIN */
			if (setsockopt(obj->s, SOL_SOCKET, SO_RCVBUFFORCE,
				       &rcvbuf_size, sizeof(rcvbuf_size)) < 0) {
				pr_debug("SO_RCVBUFFORCE failed so try SO_RCVBUF ...\n");
				if (setsockopt(obj->s, SOL_SOCKET, SO_RCVBUF,
					       &rcvbuf_size, sizeof(rcvbuf_size)) < 0) {
					perror("setsockopt SO_RCVBUF");
					return 1;
				}

				if (getsockopt(obj->s, SOL_SOCKET, SO_RCVBUF,
					       &curr_rcvbuf_size, &curr_rcvbuf_size_len) < 0) {
					perror("getsockopt SO_RCVBUF");
					return 1;
				}

				/* Only print a warning the first time we detect the adjustment */
				/* n.b.: The wanted size is doubled in Linux in net/sore/sock.c */
				if (!i && curr_rcvbuf_size < rcvbuf_size * 2)
					fprintf(stderr, "The socket receive buffer size was "
						"adjusted due to /proc/sys/net/core/rmem_max.\n");
			}
		}

		if (timestamp || log || logfrmt) {
			if (hwtimestamp) {
				const int timestamping_flags = (SOF_TIMESTAMPING_SOFTWARE |
								SOF_TIMESTAMPING_RX_SOFTWARE |
								SOF_TIMESTAMPING_RAW_HARDWARE);

				if (setsockopt(obj->s, SOL_SOCKET, SO_TIMESTAMPING,
					       &timestamping_flags, sizeof(timestamping_flags)) < 0) {
					perror("setsockopt SO_TIMESTAMPING is not supported by your Linux kernel");
					return 1;
				}
			} else {
				const int timestamp_on = 1;

				if (setsockopt(obj->s, SOL_SOCKET, SO_TIMESTAMP,
					       &timestamp_on, sizeof(timestamp_on)) < 0) {
					perror("setsockopt SO_TIMESTAMP");
					return 1;
				}
			}
		}

		if (dropmonitor) {
			const int dropmonitor_on = 1;

			if (setsockopt(obj->s, SOL_SOCKET, SO_RXQ_OVFL,
				       &dropmonitor_on, sizeof(dropmonitor_on)) < 0) {
				perror("setsockopt SO_RXQ_OVFL not supported by your Linux Kernel");
				return 1;
			}
		}

		if (bind(obj->s, (struct sockaddr *)&addr, sizeof(addr)) < 0) {
			perror("bind");
			return 1;
		}
	}

	if (log) {
		if (!logname) {
			time_t currtime;
			struct tm now;

			if (time(&currtime) == (time_t)-1) {
				perror("time");
				return 1;
			}

			localtime_r(&currtime, &now);

			snprintf(fname, sizeof(fname), "candump-%04d-%02d-%02d_%02d%02d%02d.log",
				now.tm_year + 1900,
				now.tm_mon + 1,
				now.tm_mday,
				now.tm_hour,
				now.tm_min,
				now.tm_sec);

			logname = fname;
		}

		if (silent != SILENT_ON)
			fprintf(stderr, "Warning: Console output active while logging!\n");

		fprintf(stderr, "Enabling Logfile '%s'\n", logname);

		logfile = fopen(logname, "w");
		if (!logfile) {
			perror("logfile");
			return 1;
		}
	}

	/* these settings are static and can be held out of the hot path */
	iov.iov_base = &cu;
	msg.msg_name = &addr;
	msg.msg_iov = &iov;
	msg.msg_iovlen = 1;
	msg.msg_control = &ctrlmsg;

	while (running) {
		num_events = epoll_wait(fd_epoll, events_pending, currmax, timeout_ms);
		if (num_events == -1) {
			if (errno != EINTR)
				running = 0;
			continue;
		}

		/* handle timeout */
		if (!num_events && timeout_ms >= 0) {
			running = 0;
			continue;
		}

		for (i = 0; i < num_events; i++) { /* check waiting CAN RAW sockets */
			struct if_info *obj = events_pending[i].data.ptr;
			int idx;
			char *extra_info = "";

			/* these settings may be modified by recvmsg() */
			iov.iov_len = sizeof(cu);
			msg.msg_namelen = sizeof(addr);
			msg.msg_controllen = sizeof(ctrlmsg);
			msg.msg_flags = 0;

			nbytes = recvmsg(obj->s, &msg, 0);
			idx = idx2dindex(addr.can_ifindex, obj->s);

			if (nbytes < 0) {
				if ((errno == ENETDOWN) && !down_causes_exit) {
					fprintf(stderr, "%s: interface down\n", devname[idx]);
					continue;
				}
				perror("read");
				return 1;
			}

			/* mark dual-use struct canfd_frame */
			if (nbytes < (int)CANXL_HDR_SIZE + CANXL_MIN_DLEN) {
				fprintf(stderr, "read: no CAN frame\n");
				return 1;
			}

			if (cu.xl.flags & CANXL_XLF) {
				if (nbytes != (int)CANXL_HDR_SIZE + cu.xl.len) {
					printf("nbytes = %d\n", nbytes);
					fprintf(stderr, "read: no CAN XL frame\n");
					return 1;
				}
			} else {
				if (nbytes == CAN_MTU)
					cu.fd.flags = 0;
				else if (nbytes == CANFD_MTU)
					cu.fd.flags |= CANFD_FDF;
				else {
					fprintf(stderr, "read: incomplete CAN CC/FD frame\n");
					return 1;
				}
			}

			if (count && (--count == 0))
				running = 0;

			for (cmsg = CMSG_FIRSTHDR(&msg);
			     cmsg && (cmsg->cmsg_level == SOL_SOCKET);
			     cmsg = CMSG_NXTHDR(&msg,cmsg)) {
				if (cmsg->cmsg_type == SO_TIMESTAMP) {
					memcpy(&tv, CMSG_DATA(cmsg), sizeof(tv));
				} else if (cmsg->cmsg_type == SO_TIMESTAMPING) {
					struct timespec *stamp = (struct timespec *)CMSG_DATA(cmsg);

					/*
					 * stamp[0] is the software timestamp
					 * stamp[1] is deprecated
					 * stamp[2] is the raw hardware timestamp
					 * See chapter 2.1.2 Receive timestamps in
					 * linux/Documentation/networking/timestamping.txt
					 */
					tv.tv_sec = stamp[2].tv_sec;
					tv.tv_usec = stamp[2].tv_nsec / 1000;
				} else if (cmsg->cmsg_type == SO_RXQ_OVFL) {
					memcpy(&obj->dropcnt, CMSG_DATA(cmsg), sizeof(__u32));
				}
			}

			/* check for (unlikely) dropped frames on this specific socket */
			if (obj->dropcnt != obj->last_dropcnt) {
				__u32 frames = obj->dropcnt - obj->last_dropcnt;

				if (silent != SILENT_ON)
					printf("DROPCOUNT: dropped %u CAN frame%s on '%s' socket (total drops %u)\n",
					       frames, (frames > 1)?"s":"", devname[idx], obj->dropcnt);

				if (log)
					fprintf(logfile, "DROPCOUNT: dropped %u CAN frame%s on '%s' socket (total drops %u)\n",
						frames, (frames > 1)?"s":"", devname[idx], obj->dropcnt);

				obj->last_dropcnt = obj->dropcnt;
			}

			/* once we detected a EFF frame indent SFF frames accordingly */
			if (cu.fd.can_id & CAN_EFF_FLAG)
				view |= CANLIB_VIEW_INDENT_SFF;

			if (extra_msg_info) {
				if (msg.msg_flags & MSG_DONTROUTE)
					extra_info = " T";
				else
					extra_info = " R";
			}

			/* build common log format output */
			if ((log) || ((logfrmt) && (silent == SILENT_OFF))) {

				alen = sprint_timestamp(afrbuf, logtimestamp,
							  &tv, &last_tv);

				alen += sprintf(afrbuf + alen, "%*s ",
						  max_devname_len, devname[idx]);

				alen += snprintf_canframe(afrbuf + alen, sizeof(afrbuf) - alen, &cu, 0);
			}

			/* write CAN frame in log file style to logfile */
			if (log)
				fprintf(logfile, "%s%s\n", afrbuf, extra_info);

			/* print CAN frame in log file style to stdout */
			if ((logfrmt) && (silent == SILENT_OFF)) {
				printf("%s%s\n", afrbuf, extra_info);
				goto out_fflush; /* no other output to stdout */
			}

			/* print only animation */
			if (silent != SILENT_OFF) {
				if (silent == SILENT_ANI) {
					printf("%c\b", anichar[silentani %= MAXANI]);
					silentani++;
				}
				goto out_fflush; /* no other output to stdout */
			}

			/* print (colored) long CAN frame style to stdout */
			alen = sprintf(afrbuf, " %s", (color > 2) ? col_on[idx % MAXCOL] : "");
			alen += sprint_timestamp(afrbuf + alen, timestamp, &tv, &last_tv);
			alen += sprintf(afrbuf + alen, " %s%*s",
					  (color && (color < 3)) ? col_on[idx % MAXCOL] : "",
					  max_devname_len, devname[idx]);

			if (extra_msg_info) {
				if (msg.msg_flags & MSG_DONTROUTE)
					alen += sprintf(afrbuf + alen, "  TX %s",
							  extra_m_info[cu.fd.flags & 3]);
				else
					alen += sprintf(afrbuf + alen, "  RX %s",
							  extra_m_info[cu.fd.flags & 3]);
			}

			alen += sprintf(afrbuf + alen, "%s  ", (color == 1) ? col_off : "");
			alen += snprintf_long_canframe(afrbuf + alen, sizeof(afrbuf) - alen, &cu, view);

			if ((view & CANLIB_VIEW_ERROR) && (cu.fd.can_id & CAN_ERR_FLAG)) {
				alen += sprintf(afrbuf + alen, "\n\t");
				alen += snprintf_can_error_frame(afrbuf + alen,
								 sizeof(afrbuf) - alen,
								 &cu.fd, "\n\t");
			}

			printf("%s%s\n", afrbuf, (color > 1) ? col_off : "");
out_fflush:
			fflush(stdout);
		}
	}

	for (i = 0; i < currmax; i++)
		close(sock_info[i].s);

	close(fd_epoll);

	if (log)
		fclose(logfile);

	if (signal_num)
		return 128 + signal_num;

	return 0;
}